

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O3

ps_search_t *
allphone_search_init
          (char *name,ngram_model_t *lm,ps_config_t *config,acmod_t *acmod,dict_t *dict,
          dict2pid_t *d2p)

{
  byte bVar1;
  bin_mdef_t *m;
  bin_mdef_t *pbVar2;
  bin_mdef_t *pbVar3;
  mdef_entry_t *pmVar4;
  long lVar5;
  _func_void_ps_search_t_ptr *p_Var6;
  logmath_t *plVar7;
  short sVar8;
  int iVar9;
  int iVar10;
  int32 iVar11;
  int32 iVar12;
  int32 iVar13;
  ps_search_t *search;
  ps_searchfuncs_t *ppVar14;
  ps_search_t *ppVar15;
  void *ptr;
  hmm_t *hmm;
  _func_int_ps_search_t_ptr_dict_t_ptr_dict2pid_t_ptr *p_Var16;
  ushort *ptr_00;
  uint *puVar17;
  _func_char_ptr_ps_search_t_ptr_int32_ptr *p_Var18;
  ngram_model_t *pnVar19;
  char *pcVar20;
  cmd_ln_t *pcVar21;
  ps_latlink_t *ppVar22;
  int iVar23;
  ulong uVar24;
  _func_int_ps_search_t_ptr_dict_t_ptr_dict2pid_t_ptr *p_Var25;
  short sVar26;
  ulong uVar27;
  long lVar28;
  uint uVar29;
  short sVar30;
  ushort *puVar31;
  short sVar32;
  uint uVar33;
  ushort uVar34;
  int iVar35;
  ulong uVar36;
  ps_searchfuncs_t *ppVar37;
  double dVar38;
  ulong local_78;
  
  search = (ps_search_t *)
           __ckd_calloc__(1,0x108,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                          ,0x217);
  ps_search_init(search,&allphone_funcs,"allphone",name,config,acmod,dict,d2p);
  m = acmod->mdef;
  local_78 = 0;
  ppVar14 = (ps_searchfuncs_t *)
            hmm_context_init(m->n_emit_state,acmod->tmat->tp,(int16 *)0x0,m->sseq);
  search[1].vt = ppVar14;
  if (ppVar14 == (ps_searchfuncs_t *)0x0) {
    (*search->vt->free)(search);
LAB_0011d68e:
    search = (ps_search_t *)0x0;
  }
  else {
    iVar9 = ps_config_bool(config,"allphone_ci");
    *(int *)&search[1].name = iVar9;
    dVar38 = ps_config_float(config,"lw");
    *(int *)&search[1].dict = (int)dVar38;
    pbVar2 = search->acmod->mdef;
    ppVar15 = (ps_search_t *)
              __ckd_calloc__((long)pbVar2->n_ciphone,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                             ,0xeb);
    search[1].pls = ppVar15;
    ptr = __ckd_calloc__((long)pbVar2->n_phone,8,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                         ,0xed);
    iVar9 = (&pbVar2->n_ciphone)[*(int *)&search[1].name == 0];
    uVar36 = (ulong)iVar9;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0xf2,"Building PHMM net of %d phones\n");
    if (0 < (long)uVar36) {
      uVar27 = 0;
      local_78 = 0;
      do {
        pbVar3 = search->acmod->mdef;
        uVar24 = uVar27;
        if ((long)pbVar3->n_ciphone <= (long)uVar27) {
          uVar24 = (ulong)pbVar3->phone[uVar27].info.ci.reserved[0];
        }
        hmm = (hmm_t *)(&(search[1].pls)->vt)[uVar24 & 0xffffffff];
        if (hmm != (hmm_t *)0x0) {
          pmVar4 = pbVar3->phone;
          do {
            if ((pmVar4[*(int *)&hmm[1].ctx].tmat == pmVar4[uVar27].tmat) &&
               (pmVar4[*(int *)&hmm[1].ctx].ssid == pmVar4[uVar27].ssid)) goto LAB_0011d1e8;
            hmm = *(hmm_t **)((long)hmm[1].score + 0x10);
          } while (hmm != (hmm_t *)0x0);
        }
        hmm = (hmm_t *)__ckd_calloc__(1,0x80,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                      ,0xf6);
        hmm_init((hmm_context_t *)search[1].vt,hmm,0,pbVar2->phone[uVar27].ssid,
                 pbVar2->phone[uVar27].tmat);
        *(int *)&hmm[1].ctx = (int)uVar27;
        uVar34 = (ushort)uVar27;
        if ((long)pbVar2->n_ciphone <= (long)uVar27) {
          uVar34 = (ushort)pbVar2->phone[uVar27].info.ci.reserved[0];
        }
        *(ushort *)((long)&hmm[1].ctx + 4) = uVar34;
        hmm[1].history[1] = 0;
        hmm[1].history[2] = 0;
        ppVar15 = search[1].pls;
        *(ps_searchfuncs_t **)(hmm[1].score + 4) = (&ppVar15->vt)[(short)uVar34];
        (&ppVar15->vt)[(short)uVar34] = (ps_searchfuncs_t *)hmm;
        local_78 = (ulong)((int)local_78 + 1);
LAB_0011d1e8:
        *(hmm_t **)((long)ptr + uVar27 * 8) = hmm;
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar36);
    }
    iVar23 = pbVar2->n_ciphone + 0x1f;
    iVar10 = pbVar2->n_ciphone + 0x3e;
    if (-1 < iVar23) {
      iVar10 = iVar23;
    }
    iVar35 = (int)local_78 * (iVar10 >> 5);
    p_Var16 = (_func_int_ps_search_t_ptr_dict_t_ptr_dict2pid_t_ptr *)
              __ckd_calloc__((long)(iVar35 * 2),4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                             ,0x105);
    iVar23 = pbVar2->n_ciphone;
    if (0 < (long)iVar23) {
      p_Var25 = p_Var16 + (long)iVar35 * 4;
      ppVar15 = search[1].pls;
      lVar28 = (long)(iVar10 >> 5) * 4;
      sVar30 = 0;
      do {
        for (ppVar14 = (&ppVar15->vt)[sVar30]; ppVar14 != (ps_searchfuncs_t *)0x0;
            ppVar14 = (ps_searchfuncs_t *)ppVar14[1].lattice) {
          ppVar14[1].reinit = p_Var16;
          ppVar14[1].free = (_func_void_ps_search_t_ptr *)p_Var25;
          p_Var16 = p_Var16 + lVar28;
          p_Var25 = p_Var25 + lVar28;
        }
        sVar30 = sVar30 + 1;
      } while (sVar30 < iVar23);
    }
    ptr_00 = (ushort *)
             __ckd_calloc__((long)iVar23 + 1,2,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                            ,0x113);
    iVar23 = pbVar2->n_ciphone;
    uVar27 = 0;
    if (0 < iVar23) {
      sVar30 = 1;
      do {
        uVar34 = sVar30 - 1;
        lVar28 = *(long *)((long)ptr + (long)(short)uVar34 * 8);
        iVar10 = iVar23 + 0x3e;
        if (-1 < iVar23 + 0x1f) {
          iVar10 = iVar23 + 0x1f;
        }
        memset(*(void **)(lVar28 + 0x60),0xff,(long)(iVar10 >> 5) << 2);
        iVar23 = pbVar2->n_ciphone + 0x1f;
        iVar10 = pbVar2->n_ciphone + 0x3e;
        if (-1 < iVar23) {
          iVar10 = iVar23;
        }
        memset(*(void **)(lVar28 + 0x68),0xff,(long)(iVar10 >> 5) << 2);
        if (pbVar2->phone[(short)uVar34].info.ci.filler != '\0') {
          iVar23 = (int)uVar27;
          uVar27 = (ulong)(iVar23 + 1);
          ptr_00[iVar23] = uVar34;
        }
        iVar10 = (int)sVar30;
        iVar23 = pbVar2->n_ciphone;
        sVar30 = sVar30 + 1;
      } while (iVar10 < iVar23);
      uVar27 = (ulong)(int)uVar27;
    }
    ptr_00[uVar27] = 0xffff;
    if (iVar23 < iVar9) {
      pmVar4 = pbVar2->phone;
      uVar27 = (ulong)iVar23;
      do {
        lVar28 = *(long *)((long)ptr + uVar27 * 8);
        bVar1 = pmVar4[uVar27].info.ci.reserved[1];
        if (pmVar4[bVar1].info.ci.filler == '\0') {
          puVar17 = (uint *)(*(long *)(lVar28 + 0x60) + (ulong)(bVar1 >> 5) * 4);
          *puVar17 = *puVar17 | 1 << (bVar1 & 0x1f);
        }
        else {
          uVar34 = *ptr_00;
          if (-1 < (short)uVar34) {
            lVar5 = *(long *)(lVar28 + 0x60);
            puVar31 = ptr_00 + 1;
            do {
              puVar17 = (uint *)(lVar5 + (ulong)(uVar34 >> 5) * 4);
              *puVar17 = *puVar17 | 1 << ((byte)uVar34 & 0x1f);
              uVar34 = *puVar31;
              puVar31 = puVar31 + 1;
            } while (-1 < (short)uVar34);
          }
        }
        bVar1 = pmVar4[uVar27].info.ci.reserved[2];
        if (pmVar4[bVar1].info.ci.filler == '\0') {
          puVar17 = (uint *)(*(long *)(lVar28 + 0x68) + (ulong)(bVar1 >> 5) * 4);
          *puVar17 = *puVar17 | 1 << (bVar1 & 0x1f);
        }
        else {
          uVar34 = *ptr_00;
          if (-1 < (short)uVar34) {
            lVar28 = *(long *)(lVar28 + 0x68);
            puVar31 = ptr_00 + 1;
            do {
              puVar17 = (uint *)(lVar28 + (ulong)(uVar34 >> 5) * 4);
              *puVar17 = *puVar17 | 1 << ((byte)uVar34 & 0x1f);
              uVar34 = *puVar31;
              puVar31 = puVar31 + 1;
            } while (-1 < (short)uVar34);
          }
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar36);
    }
    ckd_free(ptr);
    ckd_free(ptr_00);
    ppVar15 = search[1].pls;
    pbVar2 = search->acmod->mdef;
    puVar17 = (uint *)__ckd_calloc__((long)pbVar2->n_ciphone + 1,4,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                     ,0xb5);
    iVar9 = pbVar2->n_ciphone;
    if (iVar9 < 1) {
      uVar33 = 0;
    }
    else {
      iVar23 = 0;
      sVar30 = 0;
      uVar33 = 0;
      do {
        ppVar14 = (&ppVar15->vt)[sVar30];
        if (ppVar14 != (ps_searchfuncs_t *)0x0) {
          sVar26 = (short)iVar23;
          sVar8 = sVar26 + 0x1f;
          if (-1 < sVar26) {
            sVar8 = sVar26;
          }
          do {
            iVar9 = pbVar2->n_ciphone;
            if (iVar9 < 1) {
              lVar28 = 0;
            }
            else {
              p_Var6 = ppVar14[1].free;
              uVar29 = 0;
              sVar26 = 1;
              iVar10 = 0;
              do {
                sVar32 = sVar26 + 0x1e;
                if (-1 < (short)(sVar26 + -1)) {
                  sVar32 = sVar26 + -1;
                }
                if ((*(uint *)(p_Var6 + (long)(short)((uint)(int)sVar32 >> 5) * 4) >>
                     (uVar29 & 0x1f) & 1) != 0) {
                  lVar28 = (long)iVar10;
                  iVar10 = iVar10 + 1;
                  puVar17[lVar28] = uVar29;
                  iVar9 = pbVar2->n_ciphone;
                }
                uVar29 = (uint)sVar26;
                sVar26 = sVar26 + 1;
              } while ((int)uVar29 < iVar9);
              lVar28 = (long)iVar10;
            }
            puVar17[lVar28] = 0xffffffff;
            uVar29 = *puVar17;
            if (-1 < (int)uVar29) {
              lVar28 = 0;
              do {
                for (ppVar37 = (&ppVar15->vt)[uVar29]; ppVar37 != (ps_searchfuncs_t *)0x0;
                    ppVar37 = (ps_searchfuncs_t *)ppVar37[1].lattice) {
                  if ((*(uint *)(ppVar37[1].reinit + (long)(short)((uint)(int)sVar8 >> 5) * 4) &
                      (uint)(1L << ((byte)iVar23 & 0x1f))) != 0) {
                    p_Var18 = (_func_char_ptr_ps_search_t_ptr_int32_ptr *)
                              __ckd_calloc__(1,0x10,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                                             ,200);
                    *(ps_searchfuncs_t **)p_Var18 = ppVar37;
                    *(_func_char_ptr_ps_search_t_ptr_int32_ptr **)(p_Var18 + 8) = ppVar14[1].hyp;
                    ppVar14[1].hyp = p_Var18;
                    uVar33 = uVar33 + 1;
                  }
                }
                uVar29 = puVar17[lVar28 + 1];
                lVar28 = lVar28 + 1;
              } while (-1 < (int)uVar29);
            }
            ppVar14 = (ps_searchfuncs_t *)ppVar14[1].lattice;
          } while (ppVar14 != (ps_searchfuncs_t *)0x0);
          iVar9 = pbVar2->n_ciphone;
        }
        sVar30 = sVar30 + 1;
        iVar23 = (int)sVar30;
      } while (iVar23 < iVar9);
    }
    ckd_free(puVar17);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x13b,"%d nodes, %d links\n",local_78,(ulong)uVar33);
    if (lm == (ngram_model_t *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
              ,0x244,
              "Failed to load language model specified in -allphone, doing unconstrained phone-loop decoding\n"
             );
      plVar7 = acmod->lmath;
      dVar38 = ps_config_float(config,"pip");
      iVar9 = logmath_log(plVar7,(float64)dVar38);
      *(int *)((long)&search[1].dict + 4) = iVar9 * *(int *)&search[1].dict >> 10;
    }
    else {
      pnVar19 = ngram_model_retain(lm);
      search[1].type = (char *)pnVar19;
      pcVar20 = bin_mdef_ciphone_str(m,m->sil);
      iVar11 = ngram_wid(pnVar19,pcVar20);
      iVar12 = ngram_unknown_wid((ngram_model_t *)search[1].type);
      if (iVar11 == iVar12) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                ,0x231,"Phonetic LM does not have SIL phone in vocabulary\n");
        allphone_search_free(search);
        goto LAB_0011d68e;
      }
      pcVar21 = (cmd_ln_t *)
                __ckd_calloc__((long)m->n_ciphone,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
                               ,0x238);
      search[1].config = pcVar21;
      if (0 < m->n_ciphone) {
        lVar28 = 0;
        do {
          pnVar19 = (ngram_model_t *)search[1].type;
          pcVar20 = bin_mdef_ciphone_str(m,(int32)lVar28);
          iVar12 = ngram_wid(pnVar19,pcVar20);
          (&(search[1].config)->refcount)[lVar28] = iVar12;
          iVar13 = ngram_unknown_wid((ngram_model_t *)search[1].type);
          if (iVar12 == iVar13) {
            (&(search[1].config)->refcount)[lVar28] = iVar11;
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 < m->n_ciphone);
      }
    }
    *(undefined4 *)&search[1].hyp_str = 0;
    *(undefined4 *)&search[1].d2p = 0xffffffff;
    search[1].post = 0;
    search[1].n_words = 0;
    plVar7 = acmod->lmath;
    dVar38 = ps_config_float(config,"beam");
    iVar9 = logmath_log(plVar7,(float64)dVar38);
    *(int *)&search[1].acmod = iVar9 >> 10;
    plVar7 = acmod->lmath;
    dVar38 = ps_config_float(config,"pbeam");
    iVar9 = logmath_log(plVar7,(float64)dVar38);
    *(int *)((long)&search[1].acmod + 4) = iVar9 >> 10;
    ppVar22 = (ps_latlink_t *)blkarray_list_init();
    search[1].last_link = ppVar22;
    dVar38 = ps_config_float(config,"ascale");
    *(float *)((long)&search[1].d2p + 4) = (float)(1.0 / dVar38);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
            ,0x261,"Allphone(beam: %d, pbeam: %d)\n",(ulong)*(uint *)&search[1].acmod,
            (ulong)*(uint *)((long)&search[1].acmod + 4));
    ptmr_init((ptmr_t *)&search[1].start_wid);
  }
  return search;
}

Assistant:

ps_search_t *
allphone_search_init(const char *name,
                     ngram_model_t * lm,
                     ps_config_t * config,
                     acmod_t * acmod, dict_t * dict, dict2pid_t * d2p)
{
    int i;
    bin_mdef_t *mdef;
    allphone_search_t *allphs;

    allphs = (allphone_search_t *) ckd_calloc(1, sizeof(*allphs));
    ps_search_init(ps_search_base(allphs), &allphone_funcs, PS_SEARCH_TYPE_ALLPHONE, name, config, acmod,
                   dict, d2p);
    mdef = acmod->mdef;

    allphs->hmmctx = hmm_context_init(bin_mdef_n_emit_state(mdef),
                                      acmod->tmat->tp, NULL, mdef->sseq);
    if (allphs->hmmctx == NULL) {
        ps_search_free(ps_search_base(allphs));
        return NULL;
    }

    allphs->ci_only = ps_config_bool(config, "allphone_ci");
    allphs->lw = ps_config_float(config, "lw");

    phmm_build(allphs);

    if (lm) {
	int32 silwid;
	
        allphs->lm = ngram_model_retain(lm);
        
        silwid = ngram_wid(allphs->lm, bin_mdef_ciphone_str(mdef,
                                                            mdef_silphone
                                                            (mdef)));
	if (silwid == ngram_unknown_wid(allphs->lm)) {
	    E_ERROR("Phonetic LM does not have SIL phone in vocabulary\n");
	    allphone_search_free((ps_search_t *) allphs);
	    return NULL;
	}
        
        allphs->ci2lmwid =
            (int32 *) ckd_calloc(mdef->n_ciphone,
                                 sizeof(*allphs->ci2lmwid));
        for (i = 0; i < mdef->n_ciphone; i++) {
            allphs->ci2lmwid[i] =
                ngram_wid(allphs->lm,
                          (char *) bin_mdef_ciphone_str(mdef, i));
            /* Map filler phones and other missing phones to silence if not found */
            if (allphs->ci2lmwid[i] == ngram_unknown_wid(allphs->lm))
                allphs->ci2lmwid[i] = silwid;
        }
    }
    else {
        E_WARN
            ("Failed to load language model specified in -allphone, doing unconstrained phone-loop decoding\n");
        allphs->inspen =
            (int32) (logmath_log
                     (acmod->lmath, ps_config_float(config, "pip"))
                     * allphs->lw) >> SENSCR_SHIFT;
    }

    allphs->n_tot_frame = 0;
    allphs->frame = -1;
    allphs->segments = NULL;

    /* Get search pruning parameters */
    allphs->beam
        =
        (int32) logmath_log(acmod->lmath,
                            ps_config_float(config, "beam"))
        >> SENSCR_SHIFT;
    allphs->pbeam
        =
        (int32) logmath_log(acmod->lmath,
                            ps_config_float(config, "pbeam"))
        >> SENSCR_SHIFT;

    /* LM related weights/penalties */
    allphs->history = blkarray_list_init();

    /* Acoustic score scale for posterior probabilities. */
    allphs->ascale = 1.0 / ps_config_float(config, "ascale");

    E_INFO("Allphone(beam: %d, pbeam: %d)\n", allphs->beam, allphs->pbeam);

    ptmr_init(&allphs->perf);

    return (ps_search_t *) allphs;
}